

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O0

Kind __thiscall
avro::parsing::SimpleParser<avro::parsing::DummyHandler>::advance
          (SimpleParser<avro::parsing::DummyHandler> *this,Kind k)

{
  bool bVar1;
  Kind KVar2;
  reference this_00;
  non_const_type puVar3;
  undefined8 uVar4;
  pair<avro::parsing::Symbol::Kind,_avro::parsing::Symbol::Kind> *ppVar5;
  ostream *poVar6;
  char *pcVar7;
  Exception *this_01;
  string *msg;
  Kind in_ESI;
  long in_RDI;
  Decoder *in_stack_00000048;
  SimpleParser<avro::parsing::DummyHandler> *in_stack_00000050;
  ostringstream oss;
  size_t n;
  Kind result;
  pair<avro::parsing::Symbol::Kind,_avro::parsing::Symbol::Kind> *p_1;
  RepeaterInfo *p;
  ProductionPtr pp_1;
  ProductionPtr pp;
  Symbol *s;
  string *in_stack_fffffffffffffd58;
  shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  *in_stack_fffffffffffffd60;
  ProductionPtr *in_stack_fffffffffffffd78;
  SimpleParser<avro::parsing::DummyHandler> *in_stack_fffffffffffffd80;
  ostringstream *this_02;
  size_t in_stack_fffffffffffffdc8;
  SimpleParser<avro::parsing::DummyHandler> *in_stack_fffffffffffffdd0;
  ostringstream local_220 [352];
  Kind in_stack_ffffffffffffff40;
  Kind in_stack_ffffffffffffff44;
  
  do {
    while( true ) {
      this_00 = std::
                stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                ::top((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                       *)0x201071);
      KVar2 = Symbol::kind(this_00);
      if (KVar2 == in_ESI) {
        std::
        stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
        ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
               *)0x20109d);
        return in_ESI;
      }
      bVar1 = Symbol::isTerminal(this_00);
      if (!bVar1) break;
      Symbol::kind(this_00);
      throwMismatch(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40);
    }
    KVar2 = Symbol::kind(this_00);
    switch(KVar2) {
    case sRoot:
      Symbol::
      extrap<boost::tuples::tuple<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                ((Symbol *)0x20112d);
      boost::tuples::
      get<0,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type>>
                ((cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type>_>
                  *)0x201135);
      append(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      break;
    case sRepeater:
      Symbol::
      extrap<boost::tuples::tuple<unsigned_long,bool,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                ((Symbol *)0x201282);
      puVar3 = boost::tuples::
               get<0,unsigned_long,boost::tuples::cons<bool,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type>>>>
                         ((cons<unsigned_long,_boost::tuples::cons<bool,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type>_>_>_>
                           *)0x201297);
      *puVar3 = *puVar3 - 1;
      boost::tuples::
      get<2,unsigned_long,boost::tuples::cons<bool,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type>>>>
                ((cons<unsigned_long,_boost::tuples::cons<bool,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::cons<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type>_>_>_>
                  *)0x2012ae);
      append(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      break;
    default:
      bVar1 = Symbol::isImplicitAction(this_00);
      if (!bVar1) {
        this_02 = local_220;
        std::__cxx11::ostringstream::ostringstream(this_02);
        poVar6 = std::operator<<((ostream *)this_02,"Encountered ");
        KVar2 = Symbol::kind(this_00);
        pcVar7 = Symbol::toString(KVar2);
        poVar6 = std::operator<<(poVar6,pcVar7);
        poVar6 = std::operator<<(poVar6," while looking for ");
        this_01 = (Exception *)Symbol::toString(in_ESI);
        std::operator<<(poVar6,(char *)this_01);
        msg = (string *)__cxa_allocate_exception(0x18);
        std::__cxx11::ostringstream::str();
        Exception::Exception(this_01,msg);
        __cxa_throw(msg,&Exception::typeinfo,Exception::~Exception);
      }
      DummyHandler::handle(*(DummyHandler **)(in_RDI + 8),this_00);
      KVar2 = Symbol::kind(this_00);
      if (KVar2 == sWriterUnion) {
        std::
        stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
        ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
               *)0x201448);
        selectBranch(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      }
      else {
        std::
        stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
        ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
               *)0x20146a);
      }
      break;
    case sIndirect:
      Symbol::
      extra<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>
                ((Symbol *)in_stack_fffffffffffffd58);
      std::
      stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
             *)0x20116a);
      append(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::~shared_ptr((shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                     *)0x20118d);
      break;
    case sSymbolic:
      Symbol::
      extra<boost::weak_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>
                ((Symbol *)in_stack_fffffffffffffd58);
      boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>::
      shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>
                (in_stack_fffffffffffffd60,
                 (weak_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                  *)in_stack_fffffffffffffd58);
      boost::weak_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
      ~weak_ptr((weak_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                 *)0x2011f3);
      std::
      stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
             *)0x201201);
      append(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::~shared_ptr((shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                     *)0x201224);
      break;
    case sSkipStart:
      std::
      stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
             *)0x2013e5);
      skip(in_stack_00000050,in_stack_00000048);
      break;
    case sResolve:
      ppVar5 = Symbol::extrap<std::pair<avro::parsing::Symbol::Kind,avro::parsing::Symbol::Kind>>
                         ((Symbol *)0x201386);
      assertMatch(sTerminalLow,0x2013a5);
      KVar2 = ppVar5->first;
      std::
      stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
      ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
             *)0x2013c4);
      return KVar2;
    case sError:
      uVar4 = __cxa_allocate_exception(0x18);
      Symbol::extra<std::__cxx11::string>((Symbol *)in_stack_fffffffffffffd58);
      Exception::Exception((Exception *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      __cxa_throw(uVar4,&Exception::typeinfo,Exception::~Exception);
    }
  } while( true );
}

Assistant:

Symbol::Kind advance(Symbol::Kind k) {
        for (; ;) {
            Symbol& s = parsingStack.top();
            if (s.kind() == k) {
                parsingStack.pop();
                return k;
            } else if (s.isTerminal()) {
                throwMismatch(k, s.kind());
            } else {
                switch (s.kind()) {
                case Symbol::sRoot:
                    append(boost::tuples::get<0>(*s.extrap<RootInfo>()));
                    continue;
                case Symbol::sIndirect:
                    {
                        ProductionPtr pp =
                            s.extra<ProductionPtr>();
                        parsingStack.pop();
                        append(pp);
                    }
                    continue;
                case Symbol::sSymbolic:
                    {
                        ProductionPtr pp(
                            s.extra<boost::weak_ptr<Production> >());
                        parsingStack.pop();
                        append(pp);
                    }
                    continue;
                case Symbol::sRepeater:
                    {
                        RepeaterInfo *p = s.extrap<RepeaterInfo>();
                        --boost::tuples::get<0>(*p);
                        append(boost::tuples::get<2>(*p));
                    }
                    continue;
                case Symbol::sError:
                    throw Exception(s.extra<std::string>());
                case Symbol::sResolve:
                    {
                        const std::pair<Symbol::Kind, Symbol::Kind>* p =
                            s.extrap<std::pair<Symbol::Kind, Symbol::Kind> >();
                        assertMatch(p->second, k);
                        Symbol::Kind result = p->first;
                        parsingStack.pop();
                        return result;
                    }
                case Symbol::sSkipStart:
                    parsingStack.pop();
                    skip(*decoder_);
                    break;
                default:
                    if (s.isImplicitAction()) {
                        size_t n = handler_.handle(s);
                        if (s.kind() == Symbol::sWriterUnion) {
                            parsingStack.pop();
                            selectBranch(n); 
                        } else {
                            parsingStack.pop();
                        }
                    } else {
                        std::ostringstream oss;
                        oss << "Encountered " << Symbol::toString(s.kind())
                            << " while looking for " << Symbol::toString(k);
                        throw Exception(oss.str());
                    }
                }
            }
        }
    }